

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_st.c
# Opt level: O2

err_t cmdStDo(u32 tests)

{
  bool_t bVar1;
  err_t eVar2;
  octet *poVar3;
  octet *poVar4;
  size_t pwd_len;
  octet oid [11];
  octet pubkey [64];
  char pwd [17];
  octet hash [32];
  octet privkey [32];
  octet buf [32];
  undefined1 local_558 [304];
  octet state [1024];
  
  if ((tests & 0x1f) != 0) {
    if ((tests & 1) != 0) {
      bashHashStart(state,0x80);
      poVar3 = beltH();
      bashHashStepH(poVar3,0,state);
      bashHashStepG(buf,0x20,state);
      bVar1 = hexEq(buf,"114C3DFAE373D9BCBC3602D6386F2D6A2059BA1BF9048DBAA5146A6CB775709D");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      bashPrgStart(state,0x100,2,(octet *)0x0,0,poVar3,0x20);
      poVar3 = beltH();
      bashPrgAbsorb(poVar3 + 0x20,0x5f,state);
      bashPrgRatchet(state);
      bashPrgSqueeze(pubkey,0x10,state);
      bVar1 = hexEq(pubkey,"71CC358A0D5082173DE04803F7E905CB");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      bashPrgStart(state,0x80,1,poVar3 + 0x80,0x10,pubkey,0x10);
      poVar3 = beltH();
      memCopy(buf,poVar3 + 0xa0,0x17);
      bashPrgEncr(buf,0x17,state);
      bVar1 = hexEq(buf,"51ED3B28D345FFD1AD22815B86ECC17C278C8FE8920214");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      bashPrgStart(state,0x80,1,poVar3 + 0x80,0x10,pubkey,0x10);
      bashPrgDecr(buf,0x17,state);
      poVar3 = beltH();
      bVar1 = memEq(buf,poVar3 + 0xa0,0x17);
      if (bVar1 == 0) {
        return 0x20a;
      }
    }
    if ((tests & 2) != 0) {
      poVar3 = beltH();
      eVar2 = belsShare3(state,5,3,0x20,poVar3);
      if (eVar2 != 0) {
        return 0x20a;
      }
      eVar2 = belsRecover2(buf,1,0x20,state);
      if (eVar2 != 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      bVar1 = memEq(buf,poVar3,0x20);
      if (bVar1 != 0) {
        return 0x20a;
      }
      eVar2 = belsRecover2(buf,2,0x20,state);
      if (eVar2 != 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      bVar1 = memEq(buf,poVar3,0x20);
      if (bVar1 != 0) {
        return 0x20a;
      }
      eVar2 = belsRecover2(buf,3,0x20,state);
      if (eVar2 != 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      bVar1 = memEq(buf,poVar3,0x20);
      if (bVar1 == 0) {
        return 0x20a;
      }
    }
    if ((tests & 4) != 0) {
      builtin_strncpy(pwd,"B194BAC80A08F53B",0x11);
      poVar3 = beltH();
      memCopy(buf,poVar3,0x30);
      poVar3 = beltH();
      beltECBStart(state,poVar3 + 0x80,0x20);
      beltECBStepE(buf,0x10,state);
      bVar1 = hexEq(buf,"69CCA1C93557C9E3D66BC3E0FA88FA6E");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      memCopy(buf,poVar3 + 0x40,0x30);
      poVar3 = beltH();
      beltECBStart(state,poVar3 + 0xa0,0x20);
      beltECBStepD(buf,0x10,state);
      bVar1 = hexEq(buf,"0DC5300600CAB840B38448E5E993F421");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      poVar4 = beltH();
      beltMAC(buf,poVar3,0xd,poVar4 + 0x80,0x20);
      bVar1 = hexEq(buf,"7260DA60138F96C9");
      if (bVar1 == 0) {
        return 0x20a;
      }
      pwd_len = strLen(pwd);
      poVar3 = beltH();
      beltPBKDF2(buf,(octet *)pwd,pwd_len,10000,poVar3 + 0xc0,8);
      bVar1 = hexEq(buf,"3D331BBBB1FBBB40E4BF22F6CB9A689EF13A77DC09ECF93291BFE42439A72E7D");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      poVar4 = beltH();
      beltCHEStart(state,poVar3 + 0x80,0x20,poVar4 + 0xc0);
      poVar3 = beltH();
      memCopy(buf,poVar3,0xf);
      beltCHEStepE(buf,0xf,state);
      poVar3 = beltH();
      beltCHEStepI(poVar3 + 0x10,0x20,state);
      beltCHEStepA(buf,0xf,state);
      beltCHEStepG(pubkey,state);
      bVar1 = hexEq(buf,"BF3DAEAF5D18D2BCC30EA62D2E70A4");
      if (bVar1 == 0) {
        return 0x20a;
      }
      bVar1 = hexEq(pubkey,"548622B844123FF7");
      if (bVar1 == 0) {
        return 0x20a;
      }
      bVar1 = beltCHEStepV(pubkey,state);
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      poVar4 = beltH();
      beltCHEStart(state,poVar3 + 0xa0,0x20,poVar4 + 0xd0);
      poVar3 = beltH();
      memCopy(buf,poVar3 + 0x40,0x14);
      poVar3 = beltH();
      beltCHEStepI(poVar3 + 0x50,0x20,state);
      beltCHEStepA(buf,0x14,state);
      beltCHEStepD(buf,0x14,state);
      beltCHEStepG(pubkey,state);
      bVar1 = hexEq(buf,"2BABF43EB37B5398A9068F31A3C758B762F44AA9");
      if (bVar1 == 0) {
        return 0x20a;
      }
      bVar1 = hexEq(pubkey,"7D9D4F59D40D197D");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      beltWBLStart(state,poVar3 + 0x80,0x20);
      poVar3 = beltH();
      memCopy(buf,poVar3,0x20);
      poVar3 = beltH();
      memCopy(local_558,poVar3 + 0x20,0x10);
      beltWBLStepE(buf,0x30,state);
      bVar1 = hexEq(buf,
                    "49A38EE108D6C742E52B774F00A6EF98B106CBD13EA4FB0680323051BC04DF76E487B055C69BCF541176169F1DC9F6C8"
                   );
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      beltWBLStart(state,poVar3 + 0xa0,0x20);
      poVar3 = beltH();
      memCopy(buf,poVar3 + 0x40,0x30);
      beltWBLStepD(buf,0x30,state);
      bVar1 = hexEq(buf,"92632EE0C21AD9E09A39343E5C07DAA4889B03F2E6847EB152EC99F7A4D9F154");
      if (bVar1 == 0) {
        return 0x20a;
      }
      bVar1 = hexEq(local_558,"B5EF68D8E4A39E567153DE13D72254EE");
      if (bVar1 == 0) {
        return 0x20a;
      }
      beltHashStart(state);
      poVar3 = beltH();
      beltHashStepH(poVar3,0xd,state);
      beltHashStepG(pubkey,state);
      bVar1 = hexEq(pubkey,"ABEF9725D4C5A83597A367D14494CC2542F20F659DDFECC961A3EC550CBA8C75");
      if (bVar1 == 0) {
        return 0x20a;
      }
    }
    if ((tests & 8) != 0) {
      builtin_memcpy(oid,"\x06\t*p",5);
      oid[5] = '\x02';
      oid[6] = '\0';
      oid[7] = '\"';
      oid[8] = 'e';
      oid[9] = '\x1f';
      oid[10] = 'Q';
      hexTo(privkey,"1F66B5B84B7339674533F0329C74F21834281FED0732429E0C79235FC273E269");
      prngEchoStart(state,privkey,0x20);
      eVar2 = bignParamsStd((bign_params *)buf,"1.2.112.0.2.0.34.101.45.3.1");
      if (eVar2 != 0) {
        return 0x20a;
      }
      eVar2 = bignKeypairGen(privkey,pubkey,(bign_params *)buf,prngEchoStepR,state);
      if (eVar2 != 0) {
        return 0x20a;
      }
      bVar1 = hexEq(pubkey,
                    "BD1A5650179D79E03FCEE49D4C2BD5DDF54CE46D0CF11E4FF87BF7A890857FD07AC6A60361E8C8173491686D461B2826190C2EDA5909054A9AB84D2AB9D99A90"
                   );
      if (bVar1 == 0) {
        return 0x20a;
      }
      eVar2 = bignPubkeyVal((bign_params *)buf,pubkey);
      if (eVar2 != 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      eVar2 = beltHash(hash,poVar3,0xd);
      if (eVar2 != 0) {
        return 0x20a;
      }
      eVar2 = bignSign2((octet *)pwd,(bign_params *)buf,oid,0xb,hash,privkey,(void *)0x0,0);
      if (eVar2 != 0) {
        return 0x20a;
      }
      bVar1 = hexEq(pwd,
                    "19D32B7E01E25BAE4A70EB6BCA42602CCA6A13944451BCC5D4C54CFD8737619C328B8A58FB9C68FD17D569F7D06495FB"
                   );
      if (bVar1 == 0) {
        return 0x20a;
      }
      eVar2 = bignVerify((bign_params *)buf,oid,0xb,hash,(octet *)pwd,pubkey);
      if (eVar2 != 0) {
        return 0x20a;
      }
      pwd._0_8_ = pwd._0_8_ ^ 1;
      eVar2 = bignVerify((bign_params *)buf,oid,0xb,hash,(octet *)pwd,pubkey);
      if (eVar2 == 0) {
        return 0x20a;
      }
    }
    if ((tests & 0x10) != 0) {
      poVar3 = beltH();
      memCopy(buf,poVar3,0x60);
      poVar3 = beltH();
      poVar4 = beltH();
      brngCTRStart(state,poVar3 + 0x80,poVar4 + 0xc0);
      brngCTRStepR(buf,0x60,state);
      bVar1 = hexEq(buf,
                    "1F66B5B84B7339674533F0329C74F21834281FED0732429E0C79235FC273E2694C0E74B2CD5811AD21F23DE7E0FA742C3ED6EC483C461CE15C33A77AA308B7D20F51D91347617C20BD4AB07AEF4F26A1AD1362A8F9A3D42FBE1B8E6F1C88AAD5"
                   );
      if (bVar1 == 0) {
        return 0x20a;
      }
    }
  }
  if (((tests >> 0x18 & 1) != 0) && (eVar2 = cmdRngStart(1), eVar2 != 0)) {
    return eVar2;
  }
  if (((tests >> 0x19 & 1) != 0) && (eVar2 = cmdStampSelfVal(), eVar2 != 0)) {
    return eVar2;
  }
  return 0;
}

Assistant:

err_t cmdStDo(u32 tests)
{
	err_t code = ERR_OK;
	// algs?
	if (tests & CMD_ST_ALGS)
	{
		code = cmdStAlgs(tests);
		ERR_CALL_CHECK(code);
	}
	// rng?
	if (tests & CMD_ST_RNG)
	{
		code = cmdRngStart(TRUE);
		ERR_CALL_CHECK(code);
	}
	// stamp?
	if (tests & CMD_ST_STAMP)
	{
		code = cmdStampSelfVal();
		ERR_CALL_CHECK(code);
	}
	return code;
}